

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Path.cpp
# Opt level: O2

const_iterator * __thiscall
llvm::sys::path::begin(const_iterator *__return_storage_ptr__,path *this,StringRef path,Style style)

{
  byte bVar1;
  char cVar2;
  char cVar3;
  int iVar4;
  Style SVar5;
  size_t From;
  char *pcVar6;
  StringRef Chars;
  StringRef local_38;
  
  local_38.Length = (size_t)path.Data;
  SVar5 = (Style)path.Length;
  (__return_storage_ptr__->Path).Data = (char *)this;
  (__return_storage_ptr__->Path).Length = local_38.Length;
  local_38.Data = (char *)this;
  if ((char *)local_38.Length == (char *)0x0) {
    pcVar6 = (char *)0x0;
    goto LAB_00dbd62e;
  }
  if ((char *)local_38.Length != (char *)0x1 && SVar5 == windows) {
    bVar1 = StringRef::operator[](&local_38,0);
    iVar4 = isalpha((uint)bVar1);
    if ((iVar4 != 0) && (cVar2 = StringRef::operator[](&local_38,1), cVar2 == ':')) {
      pcVar6 = (char *)0x2;
      if (local_38.Length < (char *)0x2) {
        pcVar6 = (char *)local_38.Length;
      }
      goto LAB_00dbd62e;
    }
  }
  if (local_38.Length < (char *)0x3) {
LAB_00dbd5c7:
    cVar2 = StringRef::operator[](&local_38,0);
    if ((cVar2 == '/') || (SVar5 == windows && cVar2 == '\\')) {
      pcVar6 = (char *)(ulong)((char *)local_38.Length != (char *)0x0);
      goto LAB_00dbd62e;
    }
    pcVar6 = "/";
    if (SVar5 == windows) {
      pcVar6 = "\\/";
    }
    From = 0;
  }
  else {
    cVar2 = StringRef::operator[](&local_38,0);
    if ((cVar2 != '/') && (SVar5 != windows || cVar2 != '\\')) goto LAB_00dbd5c7;
    cVar2 = StringRef::operator[](&local_38,0);
    cVar3 = StringRef::operator[](&local_38,1);
    if (cVar2 != cVar3) goto LAB_00dbd5c7;
    cVar2 = StringRef::operator[](&local_38,2);
    if ((cVar2 == '/') || (SVar5 == windows && cVar2 == '\\')) goto LAB_00dbd5c7;
    pcVar6 = "/";
    if (SVar5 == windows) {
      pcVar6 = "\\/";
    }
    From = 2;
  }
  Chars.Length = (ulong)(SVar5 == windows) + 1;
  Chars.Data = pcVar6;
  pcVar6 = (char *)StringRef::find_first_of(&local_38,Chars,From);
  if (local_38.Length < pcVar6) {
    pcVar6 = (char *)local_38.Length;
  }
LAB_00dbd62e:
  (__return_storage_ptr__->Component).Data = local_38.Data;
  (__return_storage_ptr__->Component).Length = (size_t)pcVar6;
  __return_storage_ptr__->Position = 0;
  __return_storage_ptr__->S = SVar5;
  return __return_storage_ptr__;
}

Assistant:

const_iterator begin(StringRef path, Style style) {
  const_iterator i;
  i.Path      = path;
  i.Component = find_first_component(path, style);
  i.Position  = 0;
  i.S = style;
  return i;
}